

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_command_buffer_khr
clCreateCommandBufferKHR
          (cl_uint num_queues,cl_command_queue *queues,cl_command_buffer_properties_khr *properties,
          cl_int *errcode_ret)

{
  _Rb_tree_header *p_Var1;
  CTracker *pCVar2;
  bool bVar3;
  ulong enqueueCounter;
  CLIntercept *this;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  cl_int localErrorCode;
  cl_platform_id platform;
  cl_device_id device;
  time_point local_b8;
  time_point local_b0;
  cl_int local_a4;
  string local_a0;
  string local_80;
  _Base_ptr local_60;
  cl_command_queue local_58;
  string local_50;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) goto LAB_0013f446;
  if (queues == (cl_command_queue *)0x0 || num_queues == 0) {
    local_58 = (cl_command_queue)0x0;
  }
  else {
    local_58 = *queues;
  }
  local_50._M_dataplus._M_p = (pointer)0x0;
  (*(g_pIntercept->m_Dispatch).clGetCommandQueueInfo)(local_58,0x1091,8,&local_50,(size_t *)0x0);
  local_80._M_dataplus._M_p = (pointer)0x0;
  (*(this->m_Dispatch).clGetDeviceInfo)
            ((cl_device_id)local_50._M_dataplus._M_p,0x1031,8,&local_80,(size_t *)0x0);
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[*(pointer *)(p_Var6 + 1) < local_80._M_dataplus._M_p]) {
    if (*(pointer *)(p_Var6 + 1) >= local_80._M_dataplus._M_p) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var6 = p_Var5, local_80._M_dataplus._M_p < *(pointer *)(p_Var5 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    local_80._M_dataplus._M_p = (pointer)0x0;
    pmVar4 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)&local_80);
  }
  else {
    pmVar4 = (mapped_type *)&p_Var6[1]._M_parent;
  }
  local_60 = (_Base_ptr)pmVar4->clCreateCommandBufferKHR;
  if (local_60 != (_Base_ptr)0x0) {
    enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::getObjectListString<_cl_command_queue*>(this,num_queues,queues,&local_80);
      CLIntercept::getCommandBufferPropertiesString(this,properties,&local_50);
    }
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::callLoggingEnter
                (this,"clCreateCommandBufferKHR",enqueueCounter,(cl_kernel)0x0,
                 "queues = %s, properties = [ %s ]",local_80._M_dataplus._M_p,
                 local_50._M_dataplus._M_p);
    }
    local_a4 = 0;
    if ((((this->m_Config).CallLogging == false) && ((this->m_Config).ErrorLogging == false)) &&
       ((this->m_Config).ErrorAssert == false)) {
      if ((errcode_ret == (cl_int *)0x0) && ((this->m_Config).NoErrors != false)) {
LAB_0013f203:
        errcode_ret = &local_a4;
      }
    }
    else if (errcode_ret == (cl_int *)0x0) goto LAB_0013f203;
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      local_b0.__d.__r = (duration)0;
    }
    else {
      local_b0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    properties = (cl_command_buffer_properties_khr *)
                 (*(code *)pmVar4->clCreateCommandBufferKHR)(num_queues,queues,properties);
    if (((this->m_Config).HostPerformanceTiming == false) &&
       ((this->m_Config).ChromeCallLogging != true)) {
      local_b8.__d.__r = (duration)0;
    }
    else {
      local_b8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
          (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
        CLIntercept::updateHostTimingStats
                  (this,"clCreateCommandBufferKHR",&local_a0,local_b0,local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
    }
    bVar3 = (this->m_Config).ErrorLogging;
    if ((((bVar3 != false) || ((this->m_Config).ErrorAssert != false)) ||
        ((this->m_Config).NoErrors == true)) && (*errcode_ret != 0)) {
      if (bVar3 != false) {
        CLIntercept::logError(this,"clCreateCommandBufferKHR",*errcode_ret);
      }
      if ((this->m_Config).ErrorAssert == true) {
        raise(5);
      }
      if ((this->m_Config).NoErrors == true) {
        *errcode_ret = 0;
      }
    }
    if (((cl_command_buffer_khr)properties != (cl_command_buffer_khr)0x0) &&
       ((this->m_Config).LeakChecking != false)) {
      LOCK();
      pCVar2 = &(this->m_ObjectTracker).m_CommandBuffers;
      (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i =
           (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
    }
    if (((cl_command_buffer_khr)properties != (cl_command_buffer_khr)0x0) &&
       ((this->m_Config).DumpCommandBuffers == true)) {
      CLIntercept::recordCommandBufferCreate
                (this,(cl_command_buffer_khr)properties,num_queues,queues);
    }
    if ((this->m_Config).CallLogging == true) {
      CLIntercept::callLoggingExit
                (this,"clCreateCommandBufferKHR",*errcode_ret,(cl_event *)0x0,
                 (cl_sync_point_khr *)0x0,"returned %p",properties);
    }
    if ((this->m_Config).ChromeCallLogging == true) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
      CLIntercept::chromeCallLoggingExit
                (this,"clCreateCommandBufferKHR",&local_a0,false,0,local_b0,local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
    }
    if ((cl_command_buffer_khr)properties != (cl_command_buffer_khr)0x0) {
      CLIntercept::addCommandBufferInfo(this,(cl_command_buffer_khr)properties,local_58);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
  }
  if (local_60 != (_Base_ptr)0x0) {
    return (cl_command_buffer_khr)properties;
  }
LAB_0013f446:
  if (errcode_ret != (cl_int *)0x0) {
    *errcode_ret = -0x1e;
  }
  return (cl_command_buffer_khr)0x0;
}

Assistant:

CL_API_ENTRY cl_command_buffer_khr CL_API_CALL clCreateCommandBufferKHR(
    cl_uint num_queues,
    const cl_command_queue* queues,
    const cl_command_buffer_properties_khr* properties,
    cl_int* errcode_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        cl_command_queue queue = num_queues && queues ? queues[0] : NULL;
        const auto& dispatchX = pIntercept->dispatchX(queue);
        if( dispatchX.clCreateCommandBufferKHR )
        {
            GET_ENQUEUE_COUNTER();

            std::string queueList;
            std::string propsStr;
            if( pIntercept->config().CallLogging )
            {
                pIntercept->getObjectListString(
                    num_queues,
                    queues,
                    queueList );
                pIntercept->getCommandBufferPropertiesString(
                    properties,
                    propsStr );
            }
            CALL_LOGGING_ENTER( "queues = %s, properties = [ %s ]",
                queueList.c_str(),
                propsStr.c_str() );
            CHECK_ERROR_INIT( errcode_ret );
            HOST_PERFORMANCE_TIMING_START();

            cl_command_buffer_khr   retVal = dispatchX.clCreateCommandBufferKHR(
                num_queues,
                queues,
                properties,
                errcode_ret );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( errcode_ret[0] );
            ADD_OBJECT_ALLOCATION( retVal );
            RECORD_COMMAND_BUFFER_CREATE( retVal, num_queues, queues );
            CALL_LOGGING_EXIT( errcode_ret[0], "returned %p", retVal );

            if( retVal != NULL )
            {
                pIntercept->addCommandBufferInfo(
                    retVal,
                    queue );
            }

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_SET_ERROR_RETURN_NULL(errcode_ret, CL_INVALID_VALUE);
}